

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O0

intptr_t DlgProc(uintptr_t pDlg,char *DlgItemName,intptr_t Msg,intptr_t wParam,intptr_t lParam)

{
  bool bVar1;
  int iVar2;
  Json *pJVar3;
  string *psVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  *pmVar5;
  intptr_t iVar6;
  mapped_type *pmVar7;
  char *value;
  bool local_572;
  bool local_53a;
  bool local_502;
  Json local_4e8;
  string local_4d8;
  allocator local_4b1;
  key_type local_4b0;
  Json local_490;
  allocator local_479;
  key_type local_478;
  Json local_458;
  allocator local_441;
  key_type local_440;
  Json local_420;
  allocator local_409;
  key_type local_408;
  Json local_3e8;
  allocator local_3d1;
  key_type local_3d0;
  Json local_3b0;
  allocator local_399;
  key_type local_398;
  Json local_378;
  int local_364;
  string local_360 [4];
  int res;
  ofstream ofs;
  undefined1 local_160 [8];
  object json_obj;
  string local_128;
  allocator local_101;
  string local_100;
  byte local_db;
  byte local_da;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  intptr_t local_30;
  intptr_t lParam_local;
  intptr_t wParam_local;
  intptr_t Msg_local;
  char *DlgItemName_local;
  uintptr_t pDlg_local;
  
  local_30 = lParam;
  lParam_local = wParam;
  wParam_local = Msg;
  Msg_local = (intptr_t)DlgItemName;
  DlgItemName_local = (char *)pDlg;
  if (Msg == 0x1001) {
    iVar2 = strcmp(DlgItemName,"btnOK");
    if (iVar2 == 0) {
      pmVar5 = json11::Json::object_items_abi_cxx11_(&gJson);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
             *)local_160,pmVar5);
      std::ofstream::ofstream(local_360);
      iVar6 = (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"getTokenRadio",0x13,0,0);
      local_364 = (int)iVar6;
      value = "manual";
      if (local_364 == 0) {
        value = "oauth";
      }
      json11::Json::Json(&local_378,value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_398,"get_token_method",&local_399);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                             *)local_160,&local_398);
      json11::Json::operator=(pmVar7,&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      json11::Json::~Json(&local_378);
      iVar6 = (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"saveMethodRadio",0x13,0,0);
      local_364 = (int)iVar6;
      if (local_364 == 1) {
        json11::Json::Json(&local_3b0,"config");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3d0,"save_type",&local_3d1);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_160,&local_3d0);
        json11::Json::operator=(pmVar7,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        json11::Json::~Json(&local_3b0);
      }
      else if (local_364 == 2) {
        json11::Json::Json(&local_3e8,"password_manager");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_408,"save_type",&local_409);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_160,&local_408);
        json11::Json::operator=(pmVar7,&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
        json11::Json::~Json(&local_3e8);
        json11::Json::Json(&local_420,"");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_440,"oauth_token",&local_441);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_160,&local_440);
        json11::Json::operator=(pmVar7,&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator((allocator<char> *)&local_441);
        json11::Json::~Json(&local_420);
      }
      else {
        json11::Json::Json(&local_458,"dont_save");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_478,"save_type",&local_479);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_160,&local_478);
        json11::Json::operator=(pmVar7,&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator((allocator<char> *)&local_479);
        json11::Json::~Json(&local_458);
        json11::Json::Json(&local_490,"");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4b0,"oauth_token",&local_4b1);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_160,&local_4b0);
        json11::Json::operator=(pmVar7,&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        json11::Json::~Json(&local_490);
      }
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open(local_360,0x27ac28);
      json11::Json::Json(&local_4e8,(object *)local_160);
      json11::Json::dump_abi_cxx11_(&local_4d8,&local_4e8);
      std::operator<<((ostream *)local_360,(string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      json11::Json::~Json(&local_4e8);
      std::ofstream::close();
      (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,(char *)Msg_local,1,1,0);
      std::ofstream::~ofstream(local_360);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
              *)local_160);
    }
    else {
      iVar2 = strcmp((char *)Msg_local,"btnCancel");
      if (iVar2 == 0) {
        (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,(char *)Msg_local,1,1,0);
      }
    }
  }
  else if ((Msg != 0x1003) && (Msg == 0x1005)) {
    std::allocator<char>::allocator();
    local_8a = 0;
    local_8b = 0;
    std::__cxx11::string::string((string *)&local_50,"get_token_method",&local_51);
    pJVar3 = json11::Json::operator[](&gJson,&local_50);
    bVar1 = json11::Json::is_string(pJVar3);
    local_502 = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string((string *)&local_88,"get_token_method",&local_89);
      local_8b = 1;
      pJVar3 = json11::Json::operator[](&gJson,&local_88);
      psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
      local_502 = std::operator==(psVar4,"manual");
    }
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (local_502 == false) {
      (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"getTokenRadio",0x14,0,0);
    }
    else {
      (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"getTokenRadio",0x14,1,0);
    }
    std::allocator<char>::allocator();
    local_da = 0;
    local_db = 0;
    std::__cxx11::string::string((string *)&local_b0,"save_type",&local_b1);
    pJVar3 = json11::Json::operator[](&gJson,&local_b0);
    bVar1 = json11::Json::is_string(pJVar3);
    local_53a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_da = 1;
      std::__cxx11::string::string((string *)&local_d8,"save_type",&local_d9);
      local_db = 1;
      pJVar3 = json11::Json::operator[](&gJson,&local_d8);
      psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
      local_53a = std::operator==(psVar4,"config");
    }
    if ((local_db & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    if ((local_da & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    if (local_53a == false) {
      std::allocator<char>::allocator();
      json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
      json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
      std::__cxx11::string::string((string *)&local_100,"save_type",&local_101);
      pJVar3 = json11::Json::operator[](&gJson,&local_100);
      bVar1 = json11::Json::is_string(pJVar3);
      local_572 = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_128,"save_type",
                   (allocator *)
                   ((long)&json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
        pJVar3 = json11::Json::operator[](&gJson,&local_128);
        psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
        local_572 = std::operator==(psVar4,"password_manager");
      }
      if ((json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_128);
      }
      if ((json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&json_obj._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      }
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      if (local_572 == false) {
        (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"saveMethodRadio",0x14,0,0);
      }
      else {
        (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"saveMethodRadio",0x14,2,0);
      }
    }
    else {
      (*gExtension->SendDlgMsg)((uintptr_t)DlgItemName_local,"saveMethodRadio",0x14,1,0);
    }
  }
  return 0;
}

Assistant:

intptr_t DCPCALL DlgProc(uintptr_t pDlg, char *DlgItemName, intptr_t Msg, intptr_t wParam, intptr_t lParam)
{
    switch (Msg){
        case DN_INITDIALOG:
            if(gJson["get_token_method"].is_string() && gJson["get_token_method"].string_value() == "manual")
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 1, 0);
            else
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 0, 0);

            if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "config")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 1, 0);
            else if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "password_manager")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 2, 0);
            else
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 0, 0); // dont_save by default

            break;

        case DN_CHANGE:
            break;

        case DN_CLICK:
            if(strcmp(DlgItemName, "btnOK")==0){
                json11::Json::object json_obj = gJson.object_items();
                std::ofstream ofs;

                int res = gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTGETITEMINDEX, 0, 0);
                json_obj["get_token_method"] = (res==0)? "oauth" : "manual";

                res = gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTGETITEMINDEX, 0, 0);
                switch(res){
                    case 1:
                        json_obj["save_type"] = "config";
                        break;
                    case 2:
                        json_obj["save_type"] = "password_manager";
                        json_obj["oauth_token"] = "";
                        break;
                    default:
                        json_obj["save_type"] = "dont_save";
                        json_obj["oauth_token"] = "";
                }

                ofs.open(gConfig_path, std::ofstream::out | std::ios::trunc);
                ofs << json11::Json(json_obj).dump();
                ofs.close();

                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            } else if(strcmp(DlgItemName, "btnCancel")==0){
                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            }

            break;
    }
    return 0;
}